

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

int yy_get_next_buffer(void)

{
  char *pcVar1;
  uint uVar2;
  FILE *__stream;
  YY_BUFFER_STATE *ppyVar3;
  size_t sVar4;
  char *pcVar5;
  YY_BUFFER_STATE pyVar6;
  int *piVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  size_t __n;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  
  pcVar1 = yytext;
  sVar4 = yy_buffer_stack_top;
  ppyVar3 = yy_buffer_stack;
  pcVar9 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar9 + (long)yy_n_chars + 1 < yy_c_buf_p) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_fill_buffer == 0) {
    iVar10 = ((long)yy_c_buf_p - (long)yytext != 1) + 1;
  }
  else {
    uVar14 = (int)yy_c_buf_p + ~(uint)yytext;
    if (0 < (int)uVar14) {
      lVar12 = 0;
      do {
        pcVar9[lVar12] = pcVar1[lVar12];
        lVar12 = lVar12 + 1;
      } while (uVar14 != (uint)lVar12);
    }
    pyVar6 = ppyVar3[sVar4];
    if (pyVar6->yy_buffer_status == 2) {
      yy_n_chars = 0;
    }
    else {
      iVar10 = pyVar6->yy_buf_size;
      pcVar9 = yy_c_buf_p;
      while (uVar2 = iVar10 + ~uVar14, yy_c_buf_p = pcVar9, (int)uVar2 < 1) {
        pyVar6 = ppyVar3[sVar4];
        pcVar1 = pyVar6->yy_ch_buf;
        if (pyVar6->yy_is_our_buffer == 0) {
          pcVar5 = (char *)0x0;
        }
        else {
          iVar10 = pyVar6->yy_buf_size;
          iVar11 = iVar10;
          if (iVar10 < 1) {
            iVar11 = iVar10 + 7;
            if (-1 < iVar10) {
              iVar11 = iVar10;
            }
            iVar11 = iVar11 >> 3;
          }
          pyVar6->yy_buf_size = iVar11 + iVar10;
          pcVar5 = (char *)realloc(pcVar1,(long)(iVar11 + iVar10 + 2));
        }
        pyVar6->yy_ch_buf = pcVar5;
        if (pcVar5 == (char *)0x0) {
          yy_fatal_error("fatal error - scanner input buffer overflow");
        }
        pcVar9 = pcVar5 + ((int)pcVar9 - (int)pcVar1);
        iVar10 = ppyVar3[sVar4]->yy_buf_size;
      }
      __n = 0x2000;
      if ((int)uVar2 < 0x2000) {
        __n = (size_t)uVar2;
      }
      if (ppyVar3[sVar4]->yy_is_interactive == 0) {
        piVar7 = __errno_location();
        *piVar7 = 0;
        while( true ) {
          sVar8 = fread(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + (int)uVar14,1,__n,
                        (FILE *)yyin);
          __stream = yyin;
          yy_n_chars = (int)sVar8;
          iVar10 = yy_n_chars;
          if ((yy_n_chars != 0) || (iVar11 = ferror((FILE *)yyin), iVar10 = yy_n_chars, iVar11 == 0)
             ) break;
          if (*piVar7 != 4) goto LAB_00105bad;
          *piVar7 = 0;
          clearerr((FILE *)__stream);
        }
      }
      else {
        uVar15 = 0;
        do {
          iVar11 = getc((FILE *)yyin);
          if ((iVar11 == -1) || (iVar11 == 10)) {
            __n = uVar15 & 0xffffffff;
            break;
          }
          yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[uVar15 + (long)(int)uVar14] = (char)iVar11
          ;
          uVar15 = uVar15 + 1;
        } while (__n != uVar15);
        iVar10 = (int)__n;
        if (iVar11 == 10) {
          iVar10 = iVar10 + 1;
          yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[__n + (long)(int)uVar14] = '\n';
        }
        if ((iVar11 == -1) && (iVar11 = ferror((FILE *)yyin), iVar11 != 0)) {
LAB_00105bad:
          yy_fatal_error("input in flex scanner failed");
        }
      }
      yy_n_chars = iVar10;
      pyVar6 = yy_buffer_stack[yy_buffer_stack_top];
    }
    pyVar6->yy_n_chars = yy_n_chars;
    iVar10 = 0;
    if (yy_n_chars == 0) {
      if (uVar14 == 0) {
        yyrestart(yyin);
        iVar10 = 1;
      }
      else {
        yy_buffer_stack[yy_buffer_stack_top]->yy_buffer_status = 2;
        iVar10 = 2;
      }
    }
    sVar4 = yy_buffer_stack_top;
    ppyVar3 = yy_buffer_stack;
    iVar11 = yy_n_chars + uVar14;
    if (yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size < iVar11) {
      iVar13 = (yy_n_chars >> 1) + iVar11;
      pcVar9 = (char *)realloc(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf,(long)iVar13);
      ppyVar3[sVar4]->yy_ch_buf = pcVar9;
      if (ppyVar3[sVar4]->yy_ch_buf == (char *)0x0) {
        yy_fatal_error("out of dynamic memory in yy_get_next_buffer()");
      }
      ppyVar3[sVar4]->yy_buf_size = iVar13 + -2;
    }
    yy_n_chars = iVar11;
    ppyVar3[sVar4]->yy_ch_buf[iVar11] = '\0';
    ppyVar3[sVar4]->yy_ch_buf[(long)iVar11 + 1] = '\0';
    yytext = ppyVar3[sVar4]->yy_ch_buf;
  }
  return iVar10;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}